

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O3

void __thiscall visualOutput::takeValue(visualOutput *this)

{
  outputArrow *poVar1;
  iterator __position;
  int *piVar2;
  WINDOW *pWVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  int val;
  int local_24;
  
  poVar1 = (this->super_output).outArr;
  iVar4 = (*(poVar1->super_arrowType)._vptr_arrowType[2])(poVar1,0xfffffffe);
  local_24 = (int)(short)iVar4;
  __position._M_current =
       (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->in,__position,&local_24);
    piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = local_24;
    piVar6 = __position._M_current + 1;
    (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  piVar2 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((local_24 == -1) && (piVar6 != piVar2)) {
    (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
    piVar6 = piVar2;
  }
  uVar7 = (long)piVar6 - (long)piVar2 >> 2;
  if ((2 < uVar7) && (((long)*piVar2 + uVar7) - 3 < (ulong)(long)this->width)) {
    flash();
    pWVar3 = this->visualWin;
    if (pWVar3 == (WINDOW *)0x0) {
      iVar8 = -1;
      iVar4 = -1;
    }
    else {
      iVar4 = (int)pWVar3->_begy;
      iVar8 = (int)pWVar3->_begx;
    }
    piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar9 = newwin(1,1,piVar6[1] + iVar4,
                    (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >>
                         2) + *piVar6 + iVar8 + -3);
    this->highlight = auVar9._0_8_;
    iVar5 = local_24 * 0x100 + 0x600;
    wbkgd(auVar9._0_8_,(short)iVar5,auVar9._8_8_,iVar5);
    mvwprintw(this->highlight,iVar4,
              (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2) + iVar8 + -3," ");
    wrefresh(this->highlight);
    delwin(this->highlight);
  }
  return;
}

Assistant:

void visualOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	in.push_back(val);

	if (val == -1)
		in.clear();

	if (in.size() > 2 && in[0] + in.size() - 3 < width) {
		flash();
		int y,x;
		getbegyx(visualWin, y, x);
		highlight = newwin(1, 1, in[1] + y, in[0] + in.size() - 3 + x);
		wbkgd(highlight, COLOR_PAIR(val + 6));
		mvwprintw(highlight, y, x + in.size() - 3, " ");
		wrefresh(highlight);
		delwin(highlight);
	}

	return;
}